

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTransport.h
# Opt level: O0

uint32_t duckdb_apache::thrift::transport::readAll<duckdb_apache::thrift::transport::TTransport>
                   (TTransport *trans,uint8_t *buf,uint32_t len)

{
  ssize_t sVar1;
  undefined8 uVar2;
  size_t in_RCX;
  uint in_EDX;
  undefined8 in_RSI;
  TTransport *in_RDI;
  uint32_t get;
  uint32_t have;
  allocator *message;
  TTransportExceptionType in_stack_ffffffffffffffac;
  TTransportException *in_stack_ffffffffffffffb0;
  allocator local_41;
  string local_40 [36];
  int local_1c;
  uint local_18;
  uint local_14;
  undefined8 local_10;
  TTransport *local_8;
  
  local_18 = 0;
  local_1c = 0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    if (local_14 <= local_18) {
      return local_18;
    }
    sVar1 = TTransport::read(local_8,(int)local_10 + local_18,(void *)(ulong)(local_14 - local_18),
                             in_RCX);
    local_1c = (int)sVar1;
    if (local_1c == 0) break;
    local_18 = local_1c + local_18;
  }
  uVar2 = __cxa_allocate_exception(0x30);
  message = &local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"No more data to read.",message);
  TTransportException::TTransportException
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,(string *)message);
  __cxa_throw(uVar2,&TTransportException::typeinfo,TTransportException::~TTransportException);
}

Assistant:

uint32_t readAll(Transport_& trans, uint8_t* buf, uint32_t len) {
  uint32_t have = 0;
  uint32_t get = 0;

  while (have < len) {
    get = trans.read(buf + have, len - have);
    if (get <= 0) {
      throw TTransportException(TTransportException::END_OF_FILE, "No more data to read.");
    }
    have += get;
  }

  return have;
}